

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

spv_result_t
spvBinaryToText(spv_const_context context,uint32_t *code,size_t wordCount,uint32_t options,
               spv_text *pText,spv_diagnostic *pDiagnostic)

{
  bool bVar1;
  pointer this;
  undefined1 local_370 [4];
  spv_result_t error;
  undefined1 local_350 [8];
  Disassembler disassembler;
  spv_context_t *local_e0;
  unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
  local_d8;
  undefined1 local_d0 [8];
  NameMapper name_mapper;
  unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
  friendly_mapper;
  undefined1 local_a0 [8];
  AssemblyGrammar grammar;
  spv_context_t hijack_context;
  spv_diagnostic *pDiagnostic_local;
  spv_text *pText_local;
  size_t sStack_28;
  uint32_t options_local;
  size_t wordCount_local;
  uint32_t *code_local;
  spv_const_context context_local;
  
  sStack_28 = wordCount;
  wordCount_local = (size_t)code;
  code_local = &context->target_env;
  spv_context_t::spv_context_t((spv_context_t *)&grammar.extInstTable_,context);
  if (pDiagnostic != (spv_diagnostic *)0x0) {
    *pDiagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer((spv_context)&grammar.extInstTable_,pDiagnostic);
  }
  spvtools::AssemblyGrammar::AssemblyGrammar
            ((AssemblyGrammar *)local_a0,(spv_const_context)&grammar.extInstTable_);
  bVar1 = spvtools::AssemblyGrammar::isValid((AssemblyGrammar *)local_a0);
  if (bVar1) {
    std::unique_ptr<spvtools::FriendlyNameMapper,std::default_delete<spvtools::FriendlyNameMapper>>
    ::unique_ptr<std::default_delete<spvtools::FriendlyNameMapper>,void>
              ((unique_ptr<spvtools::FriendlyNameMapper,std::default_delete<spvtools::FriendlyNameMapper>>
                *)&name_mapper._M_invoker);
    spvtools::GetTrivialNameMapper_abi_cxx11_();
    if ((options & 0x40) != 0) {
      local_e0 = (spv_context_t *)&grammar.extInstTable_;
      spvtools::
      MakeUnique<spvtools::FriendlyNameMapper,spv_context_t*,unsigned_int_const*&,unsigned_long_const&>
                ((spvtools *)&local_d8,&local_e0,(uint **)&wordCount_local,&stack0xffffffffffffffd8)
      ;
      std::
      unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>::
      operator=((unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
                 *)&name_mapper._M_invoker,&local_d8);
      std::
      unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>::
      ~unique_ptr(&local_d8);
      this = std::
             unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
             ::operator->((unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
                           *)&name_mapper._M_invoker);
      spvtools::FriendlyNameMapper::GetNameMapper_abi_cxx11_
                ((NameMapper *)
                 &disassembler.current_function_cfg_.blocks.
                  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
      ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)local_d0,
                  (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)&disassembler.current_function_cfg_.blocks.
                      super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                   *)&disassembler.current_function_cfg_.blocks.
                      super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                *)local_370,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                *)local_d0);
    spvtools::anon_unknown_0::Disassembler::Disassembler
              ((Disassembler *)local_350,(AssemblyGrammar *)local_a0,options,(NameMapper *)local_370
              );
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                 *)local_370);
    context_local._4_4_ =
         spvBinaryParse((spv_const_context)&grammar.extInstTable_,local_350,
                        (uint32_t *)wordCount_local,sStack_28,
                        spvtools::anon_unknown_0::DisassembleHeader,
                        spvtools::anon_unknown_0::DisassembleInstruction,pDiagnostic);
    if (context_local._4_4_ == SPV_SUCCESS) {
      context_local._4_4_ =
           spvtools::anon_unknown_0::Disassembler::SaveTextResult((Disassembler *)local_350,pText);
    }
    spvtools::anon_unknown_0::Disassembler::~Disassembler((Disassembler *)local_350);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
    ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
                 *)local_d0);
    std::
    unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>::
    ~unique_ptr((unique_ptr<spvtools::FriendlyNameMapper,_std::default_delete<spvtools::FriendlyNameMapper>_>
                 *)&name_mapper._M_invoker);
  }
  else {
    context_local._4_4_ = SPV_ERROR_INVALID_TABLE;
  }
  spv_context_t::~spv_context_t((spv_context_t *)&grammar.extInstTable_);
  return context_local._4_4_;
}

Assistant:

spv_result_t spvBinaryToText(const spv_const_context context,
                             const uint32_t* code, const size_t wordCount,
                             const uint32_t options, spv_text* pText,
                             spv_diagnostic* pDiagnostic) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  const spvtools::AssemblyGrammar grammar(&hijack_context);
  if (!grammar.isValid()) return SPV_ERROR_INVALID_TABLE;

  // Generate friendly names for Ids if requested.
  std::unique_ptr<spvtools::FriendlyNameMapper> friendly_mapper;
  spvtools::NameMapper name_mapper = spvtools::GetTrivialNameMapper();
  if (options & SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES) {
    friendly_mapper = spvtools::MakeUnique<spvtools::FriendlyNameMapper>(
        &hijack_context, code, wordCount);
    name_mapper = friendly_mapper->GetNameMapper();
  }

  // Now disassemble!
  spvtools::Disassembler disassembler(grammar, options, name_mapper);
  if (auto error =
          spvBinaryParse(&hijack_context, &disassembler, code, wordCount,
                         spvtools::DisassembleHeader,
                         spvtools::DisassembleInstruction, pDiagnostic)) {
    return error;
  }

  return disassembler.SaveTextResult(pText);
}